

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMapDetails::
NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>::
transferToRightSib(NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>
                   *this,uint32_t size,
                  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>
                  *sib,uint32_t sibSize,uint32_t count)

{
  moveRight(sib,0,count,sibSize);
  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,slang::ast::Expression_const*,8u>::
  copy<8u>((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,slang::ast::Expression_const*,8u>
            *)sib,this,size - count,0,count);
  return;
}

Assistant:

void transferToRightSib(uint32_t size, NodeBase& sib, uint32_t sibSize, uint32_t count) {
        sib.moveRight(0, count, sibSize);
        sib.copy(*this, size - count, 0, count);
    }